

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_1_8_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  float *pfVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  float *pfVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  long lVar46;
  int scale;
  float *pfVar47;
  int k_count;
  byte bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar86 [12];
  undefined1 auVar85 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar87 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  undefined1 auVar91 [64];
  int local_e8;
  float local_c8;
  
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar56._8_4_ = 0x80000000;
  auVar56._0_8_ = 0x8000000080000000;
  auVar56._12_4_ = 0x80000000;
  fVar64 = ipoint->scale;
  auVar91 = ZEXT464((uint)fVar64);
  auVar49 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)fVar64),auVar56,0xf8);
  auVar49 = ZEXT416((uint)(fVar64 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  fVar62 = -0.08 / (fVar64 * fVar64);
  scale = (int)auVar49._0_4_;
  auVar50._0_4_ = (int)auVar49._0_4_;
  auVar50._4_4_ = (int)auVar49._4_4_;
  auVar50._8_4_ = (int)auVar49._8_4_;
  auVar50._12_4_ = (int)auVar49._12_4_;
  auVar49 = vcvtdq2ps_avx(auVar50);
  auVar50 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)ipoint->x),auVar56,0xf8);
  auVar50 = ZEXT416((uint)(ipoint->x + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar52._0_8_ = (double)auVar50._0_4_;
  auVar52._8_8_ = auVar50._8_8_;
  auVar55._0_8_ = (double)fVar64;
  auVar55._8_8_ = 0;
  auVar50 = vfmadd231sd_fma(auVar52,auVar55,ZEXT816(0x3fe0000000000000));
  auVar54._0_4_ = (float)auVar50._0_8_;
  auVar54._4_12_ = auVar50._4_12_;
  auVar50 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)ipoint->y),auVar56,0xf8);
  fVar5 = auVar54._0_4_ - auVar49._0_4_;
  auVar50 = ZEXT416((uint)(ipoint->y + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar52 = ZEXT416((uint)fVar5);
  auVar51._0_8_ = (double)auVar50._0_4_;
  auVar51._8_8_ = auVar50._8_8_;
  auVar50 = vfmadd231sd_fma(auVar51,auVar55,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar50._0_8_;
  auVar53._4_12_ = auVar50._4_12_;
  fVar90 = auVar53._0_4_ - auVar49._0_4_;
  auVar49 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar64),auVar54);
  auVar50 = vpternlogd_avx512vl(auVar57,auVar49,auVar56,0xf8);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar50._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = ZEXT416((uint)fVar64);
  if (scale < (int)auVar49._0_4_) {
    auVar58._8_4_ = 0x3effffff;
    auVar58._0_8_ = 0x3effffff3effffff;
    auVar58._12_4_ = 0x3effffff;
    auVar59._8_4_ = 0x80000000;
    auVar59._0_8_ = 0x8000000080000000;
    auVar59._12_4_ = 0x80000000;
    auVar49 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar50,auVar53);
    auVar51 = vpternlogd_avx512vl(auVar59,auVar49,auVar58,0xea);
    auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
    auVar49 = vroundss_avx(auVar49,auVar49,0xb);
    if (scale < (int)auVar49._0_4_) {
      auVar49 = vfmadd231ss_fma(auVar54,auVar50,ZEXT416(0x41300000));
      auVar60._8_4_ = 0x80000000;
      auVar60._0_8_ = 0x8000000080000000;
      auVar60._12_4_ = 0x80000000;
      auVar51 = vpternlogd_avx512vl(auVar60,auVar49,auVar58,0xea);
      auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
      auVar49 = vroundss_avx(auVar49,auVar49,0xb);
      if ((int)auVar49._0_4_ + scale <= iimage->width) {
        auVar49 = vfmadd231ss_fma(auVar53,auVar50,ZEXT416(0x41300000));
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar51 = vpternlogd_avx512vl(auVar58,auVar49,auVar13,0xf8);
        auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
        auVar49 = vroundss_avx(auVar49,auVar49,0xb);
        if ((int)auVar49._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar37 = iimage->data;
          iVar18 = scale * 2;
          lVar21 = 0;
          fVar5 = fVar5 + 0.5;
          iVar35 = -0xc;
          pfVar24 = haarResponseY + 7;
          pfVar47 = haarResponseX + 7;
          do {
            auVar49._0_4_ = (float)iVar35;
            auVar49._4_12_ = in_ZMM10._4_12_;
            lVar31 = 0;
            auVar49 = vfmadd213ss_fma(auVar49,auVar50,ZEXT416((uint)(fVar90 + 0.5)));
            iVar17 = (int)auVar49._0_4_;
            iVar19 = (iVar17 + -1) * iVar2;
            iVar25 = (iVar17 + -1 + scale) * iVar2;
            iVar17 = (iVar17 + -1 + iVar18) * iVar2;
            do {
              iVar33 = (int)lVar31;
              auVar75._0_4_ = (float)(iVar33 + -0xc);
              auVar86 = in_ZMM10._4_12_;
              auVar75._4_12_ = auVar86;
              auVar87._0_4_ = (float)(iVar33 + -0xb);
              auVar87._4_12_ = auVar86;
              auVar85._0_4_ = (float)(iVar33 + -10);
              auVar85._4_12_ = auVar86;
              auVar84._0_4_ = (float)(iVar33 + -9);
              auVar84._4_12_ = auVar86;
              auVar49 = vfmadd213ss_fma(auVar75,auVar50,ZEXT416((uint)fVar5));
              auVar82._0_4_ = (float)(iVar33 + -8);
              auVar82._4_12_ = auVar86;
              auVar52 = vfmadd213ss_fma(auVar87,auVar50,ZEXT416((uint)fVar5));
              auVar81._0_4_ = (float)(iVar33 + -7);
              auVar81._4_12_ = auVar86;
              auVar55 = ZEXT416((uint)fVar5);
              auVar51 = vfmadd213ss_fma(auVar85,auVar50,auVar55);
              auVar78._0_4_ = (float)(iVar33 + -6);
              auVar78._4_12_ = auVar86;
              auVar53 = vfmadd213ss_fma(auVar84,auVar50,auVar55);
              auVar54 = vfmadd213ss_fma(auVar82,auVar50,auVar55);
              iVar40 = (int)auVar49._0_4_;
              auVar76._0_4_ = (float)(iVar33 + -5);
              auVar76._4_12_ = auVar86;
              auVar49 = vfmadd213ss_fma(auVar81,auVar50,auVar55);
              auVar55 = vfmadd213ss_fma(auVar78,auVar50,ZEXT416((uint)fVar5));
              auVar56 = vfmadd213ss_fma(auVar76,auVar50,ZEXT416((uint)fVar5));
              iVar34 = iVar40 + -1 + scale;
              iVar26 = iVar40 + -1 + iVar18;
              fVar64 = pfVar37[iVar17 + -1 + iVar40];
              iVar45 = (int)auVar52._0_4_;
              fVar63 = pfVar37[iVar19 + iVar26];
              iVar28 = iVar45 + -1 + scale;
              iVar44 = iVar45 + -1 + iVar18;
              auVar58 = SUB6416(ZEXT464(0x40000000),0);
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar34] -
                                                      pfVar37[iVar34 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              auVar57 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar40] -
                                                      pfVar37[iVar25 + iVar26])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              pfVar47[lVar31 + -7] = (fVar64 - fVar63) + auVar52._0_4_;
              pfVar24[lVar31 + -7] = auVar57._0_4_ - (fVar64 - fVar63);
              fVar64 = pfVar37[iVar17 + -1 + iVar45];
              iVar40 = (int)auVar51._0_4_;
              fVar63 = pfVar37[iVar19 + iVar44];
              iVar34 = iVar40 + -1 + scale;
              iVar26 = iVar40 + -1 + iVar18;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar28] -
                                                      pfVar37[iVar28 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar44 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar45])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar45] -
                                                      pfVar37[iVar25 + iVar44])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar44 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar45])));
              pfVar47[lVar31 + -6] = (fVar64 - fVar63) + auVar52._0_4_;
              pfVar24[lVar31 + -6] = auVar51._0_4_ - (fVar64 - fVar63);
              iVar45 = (int)auVar53._0_4_;
              fVar64 = pfVar37[iVar17 + -1 + iVar40];
              fVar63 = pfVar37[iVar19 + iVar26];
              iVar28 = iVar45 + -1 + scale;
              iVar44 = iVar45 + -1 + iVar18;
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar34] -
                                                      pfVar37[iVar34 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar40] -
                                                      pfVar37[iVar25 + iVar26])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              pfVar47[lVar31 + -5] = (fVar64 - fVar63) + auVar52._0_4_;
              pfVar24[lVar31 + -5] = auVar51._0_4_ - (fVar64 - fVar63);
              iVar40 = (int)auVar54._0_4_;
              fVar64 = pfVar37[iVar17 + -1 + iVar45];
              fVar63 = pfVar37[iVar19 + iVar44];
              in_ZMM10 = ZEXT464((uint)pfVar37[iVar44 + iVar17]);
              iVar34 = iVar40 + -1 + scale;
              iVar26 = iVar40 + -1 + iVar18;
              auVar51 = ZEXT416((uint)(pfVar37[iVar44 + iVar17] - pfVar37[iVar19 + -1 + iVar45]));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar28] -
                                                      pfVar37[iVar28 + iVar17])),auVar58,auVar51);
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar45] -
                                                      pfVar37[iVar25 + iVar44])),auVar58,auVar51);
              pfVar47[lVar31 + -4] = (fVar64 - fVar63) + auVar52._0_4_;
              pfVar24[lVar31 + -4] = auVar51._0_4_ - (fVar64 - fVar63);
              iVar45 = (int)auVar49._0_4_;
              fVar64 = pfVar37[iVar17 + -1 + iVar40];
              fVar63 = pfVar37[iVar19 + iVar26];
              iVar28 = iVar45 + -1 + scale;
              iVar44 = iVar45 + -1 + iVar18;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar34] -
                                                      pfVar37[iVar34 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar40] -
                                                      pfVar37[iVar25 + iVar26])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              pfVar47[lVar31 + -3] = (fVar64 - fVar63) + auVar49._0_4_;
              pfVar24[lVar31 + -3] = auVar52._0_4_ - (fVar64 - fVar63);
              iVar40 = (int)auVar55._0_4_;
              fVar64 = pfVar37[iVar17 + -1 + iVar45];
              fVar63 = pfVar37[iVar19 + iVar44];
              iVar34 = iVar40 + -1 + scale;
              iVar26 = iVar40 + -1 + iVar18;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar28] -
                                                      pfVar37[iVar28 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar44 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar45])));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar45] -
                                                      pfVar37[iVar25 + iVar44])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar44 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar45])));
              pfVar47[lVar31 + -2] = (fVar64 - fVar63) + auVar49._0_4_;
              pfVar24[lVar31 + -2] = auVar52._0_4_ - (fVar64 - fVar63);
              iVar45 = (int)auVar56._0_4_;
              fVar64 = pfVar37[iVar17 + -1 + iVar40];
              fVar63 = pfVar37[iVar19 + iVar26];
              iVar28 = iVar45 + -1 + scale;
              iVar44 = iVar45 + -1 + iVar18;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar34] -
                                                      pfVar37[iVar34 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar40] -
                                                      pfVar37[iVar25 + iVar26])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar26 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar40])));
              pfVar47[lVar31 + -1] = (fVar64 - fVar63) + auVar49._0_4_;
              pfVar24[lVar31 + -1] = auVar52._0_4_ - (fVar64 - fVar63);
              fVar64 = pfVar37[iVar17 + -1 + iVar45];
              fVar63 = pfVar37[iVar19 + iVar44];
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + iVar28] -
                                                      pfVar37[iVar28 + iVar17])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar44 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar45])));
              auVar52 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar25 + -1 + iVar45] -
                                                      pfVar37[iVar25 + iVar44])),auVar58,
                                        ZEXT416((uint)(pfVar37[iVar44 + iVar17] -
                                                      pfVar37[iVar19 + -1 + iVar45])));
              pfVar47[lVar31] = (fVar64 - fVar63) + auVar49._0_4_;
              pfVar24[lVar31] = auVar52._0_4_ - (fVar64 - fVar63);
              lVar31 = lVar31 + 8;
            } while (iVar33 + -0xc < 4);
            pfVar24 = pfVar24 + 0x18;
            pfVar47 = pfVar47 + 0x18;
            iVar35 = iVar35 + 1;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x18);
          goto LAB_001a142c;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar31 = 0;
  lVar21 = 0;
  iVar18 = -0xc;
  do {
    auVar65._0_4_ = (float)iVar18;
    auVar65._4_12_ = in_ZMM8._4_12_;
    auVar49 = vfmadd213ss_fma(auVar65,auVar91._0_16_,ZEXT416((uint)fVar90));
    fVar63 = auVar49._0_4_;
    iVar44 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    iVar25 = iVar44 + -1;
    iVar19 = iVar2 + iVar44;
    iVar17 = iVar2 + -1 + iVar44;
    iVar33 = iVar44 + -1 + scale;
    pfVar37 = haarResponseX;
    pfVar47 = haarResponseY;
    lVar30 = lVar31;
    iVar35 = -0xc;
    do {
      auVar66._0_4_ = (float)iVar35;
      auVar86 = in_ZMM8._4_12_;
      auVar66._4_12_ = auVar86;
      auVar54 = auVar91._0_16_;
      auVar49 = vfmadd213ss_fma(auVar66,auVar54,auVar52);
      auVar80._0_4_ = (float)(iVar35 + 1);
      auVar80._4_12_ = auVar86;
      auVar73._0_4_ = (float)(iVar35 + 2);
      auVar73._4_12_ = auVar86;
      auVar70._0_4_ = (float)(iVar35 + 3);
      auVar70._4_12_ = auVar86;
      auVar51 = vfmadd213ss_fma(auVar73,auVar54,auVar52);
      auVar53 = vfmadd213ss_fma(auVar80,auVar54,auVar52);
      fVar79 = auVar53._0_4_;
      auVar53 = vfmadd213ss_fma(auVar70,auVar54,auVar52);
      fVar63 = auVar49._0_4_;
      fVar72 = auVar51._0_4_;
      fVar68 = auVar53._0_4_;
      iVar26 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      if (((iVar44 < 1) || (iVar26 < 1)) || (iimage->height < iVar19)) {
LAB_001a0983:
        haarXY(iimage,iVar44,iVar26,scale,(float *)((long)pfVar37 + lVar30),
               (float *)((long)pfVar47 + lVar30));
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar45 = iimage->width;
        iVar34 = iVar2 + iVar26;
        if (iVar45 < iVar34) goto LAB_001a0983;
        iVar43 = iVar26 + -1 + scale;
        iVar28 = iimage->data_width;
        pfVar24 = iimage->data;
        iVar40 = iVar28 * iVar25;
        iVar42 = iVar28 * iVar17;
        fVar63 = pfVar24[iVar42 + -1 + iVar26];
        fVar69 = pfVar24[iVar40 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar40 + iVar43] - pfVar24[iVar42 + iVar43]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar24[iVar42 + -1 + iVar34] -
                                                pfVar24[iVar40 + -1 + iVar26])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar24[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar24[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar24[iVar42 + -1 + iVar34] -
                                                pfVar24[iVar40 + -1 + iVar26])));
        *(float *)((long)pfVar37 + lVar30) = (fVar63 - fVar69) + auVar49._0_4_;
        *(float *)((long)pfVar47 + lVar30) = auVar51._0_4_ - (fVar63 - fVar69);
      }
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 4);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 4);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar79) * -0x4020000000000000) + (double)fVar79);
      if (((iVar44 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar2 + iVar26, iVar45 < iVar34)))) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar40 = iVar26 + -1 + scale;
        iVar28 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar28 * iVar25;
        iVar42 = iVar28 * iVar17;
        fVar63 = pfVar3[iVar42 + -1 + iVar26];
        fVar79 = pfVar3[iVar43 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar40] - pfVar3[iVar42 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar26])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar79) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar79);
      }
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 8);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 8);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar72) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar72) * -0x4020000000000000) + (double)fVar72);
      if (((iVar44 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar2 + iVar26, iVar45 < iVar34)))) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar40 = iVar26 + -1 + scale;
        iVar28 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar28 * iVar25;
        iVar42 = iVar28 * iVar17;
        fVar63 = pfVar3[iVar42 + -1 + iVar26];
        fVar72 = pfVar3[iVar43 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar40] - pfVar3[iVar42 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar26])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar72) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar72);
      }
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 0xc);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 0xc);
      iVar26 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
      if ((((iVar44 < 1) || (iVar26 < 1)) || (iimage->height < iVar19)) ||
         (iVar34 = iVar2 + iVar26, iVar45 < iVar34)) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar40 = iVar26 + -1 + scale;
        iVar28 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar28 * iVar25;
        iVar42 = iVar28 * iVar17;
        fVar63 = pfVar3[iVar42 + -1 + iVar26];
        fVar68 = pfVar3[iVar43 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar40] - pfVar3[iVar42 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar26])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar42 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar68) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar68);
      }
      auVar49 = vpbroadcastd_avx512vl();
      auVar49 = vpaddd_avx(auVar49,_DAT_005997a0);
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 0x10);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 0x10);
      auVar49 = vcvtdq2ps_avx(auVar49);
      auVar16._4_4_ = fVar5;
      auVar16._0_4_ = fVar5;
      auVar16._8_4_ = fVar5;
      auVar16._12_4_ = fVar5;
      auVar15._4_4_ = fVar64;
      auVar15._0_4_ = fVar64;
      auVar15._8_4_ = fVar64;
      auVar15._12_4_ = fVar64;
      auVar51 = vfmadd132ps_fma(auVar49,auVar16,auVar15);
      auVar49 = vshufps_avx(auVar51,auVar51,0xff);
      uVar22 = vcmpps_avx512vl(auVar51,_DAT_00599190,0xd);
      bVar48 = (byte)(uVar22 >> 3);
      iVar26 = (int)((double)((ulong)(bVar48 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 & 1) * -0x4020000000000000) +
                    (double)auVar49._0_4_);
      if (((iVar44 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar2 + iVar26, iVar45 < iVar34)))) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar28 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar26 + -1 + scale;
        iVar42 = iVar28 * iVar25;
        iVar40 = iVar28 * iVar17;
        fVar63 = pfVar3[iVar40 + -1 + iVar26];
        fVar68 = pfVar3[iVar42 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 + iVar43] - pfVar3[iVar40 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar26])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar68) + auVar49._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar63 - fVar68);
      }
      auVar49 = vpermilpd_avx(auVar51,1);
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 0x14);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 0x14);
      bVar48 = (byte)uVar22;
      iVar26 = (int)((double)((ulong)(bVar48 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar49._0_4_);
      if (((iVar44 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar2 + iVar26, iVar45 < iVar34)))) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar28 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar26 + -1 + scale;
        iVar42 = iVar28 * iVar25;
        iVar40 = iVar28 * iVar17;
        fVar63 = pfVar3[iVar40 + -1 + iVar26];
        fVar68 = pfVar3[iVar42 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 + iVar43] - pfVar3[iVar40 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar26])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar68) + auVar49._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar63 - fVar68);
      }
      auVar49 = vmovshdup_avx(auVar51);
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 0x18);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 0x18);
      iVar26 = (int)((double)((ulong)(bVar48 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar49._0_4_);
      if ((((iVar44 < 1) || (iVar26 < 1)) || (iimage->height < iVar19)) ||
         (iVar34 = iVar2 + iVar26, iVar45 < iVar34)) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        iVar45 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar28 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar26 + -1 + scale;
        iVar42 = iVar28 * iVar25;
        iVar40 = iVar28 * iVar17;
        fVar63 = pfVar3[iVar40 + -1 + iVar26];
        fVar68 = pfVar3[iVar42 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 + iVar43] - pfVar3[iVar40 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar26])));
        auVar53 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar28 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar68) + auVar49._0_4_;
        *pfVar1 = auVar53._0_4_ - (fVar63 - fVar68);
      }
      local_c8 = auVar51._0_4_;
      pfVar24 = (float *)((long)pfVar37 + lVar30 + 0x1c);
      pfVar1 = (float *)((long)pfVar47 + lVar30 + 0x1c);
      iVar26 = (int)((double)((ulong)(bVar48 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar48 & 1) * -0x4020000000000000) + (double)local_c8);
      if (((iVar44 < 1) || (iVar26 < 1)) ||
         ((iimage->height < iVar19 || (iVar34 = iVar2 + iVar26, iVar45 < iVar34)))) {
        haarXY(iimage,iVar44,iVar26,scale,pfVar24,pfVar1);
        pfVar37 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar45 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar40 = iVar26 + -1 + scale;
        iVar28 = iVar45 * iVar25;
        iVar43 = iVar45 * iVar17;
        fVar63 = pfVar3[iVar43 + -1 + iVar26];
        fVar68 = pfVar3[iVar28 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar28 + iVar40] - pfVar3[iVar43 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar34] -
                                                pfVar3[iVar28 + -1 + iVar26])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 * iVar33 + -1 + iVar26] -
                                                pfVar3[iVar45 * iVar33 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar34] -
                                                pfVar3[iVar28 + -1 + iVar26])));
        *pfVar24 = (fVar63 - fVar68) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar68);
      }
      auVar91 = ZEXT1664(auVar50);
      lVar30 = lVar30 + 0x20;
      bVar4 = iVar35 < 4;
      iVar35 = iVar35 + 8;
    } while (bVar4);
    iVar18 = iVar18 + 1;
    lVar21 = lVar21 + 1;
    lVar31 = lVar31 + 0x60;
  } while (lVar21 != 0x18);
LAB_001a142c:
  fVar90 = auVar91._0_4_;
  auVar89._8_4_ = 0x3effffff;
  auVar89._0_8_ = 0x3effffff3effffff;
  auVar89._12_4_ = 0x3effffff;
  auVar88._8_4_ = 0x80000000;
  auVar88._0_8_ = 0x8000000080000000;
  auVar88._12_4_ = 0x80000000;
  auVar49 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 0.5)),auVar88,0xf8);
  auVar49 = ZEXT416((uint)(fVar90 * 0.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 1.5)),auVar88,0xf8);
  auVar50 = ZEXT416((uint)(fVar90 * 1.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar52 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 2.5)),auVar88,0xf8);
  auVar52 = ZEXT416((uint)(fVar90 * 2.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar51 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 3.5)),auVar88,0xf8);
  auVar51 = ZEXT416((uint)(fVar90 * 3.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar53 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 4.5)),auVar88,0xf8);
  auVar53 = ZEXT416((uint)(fVar90 * 4.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 5.5)),auVar88,0xf8);
  auVar54 = ZEXT416((uint)(fVar90 * 5.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 6.5)),auVar88,0xf8);
  auVar55 = ZEXT416((uint)(fVar90 * 6.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 7.5)),auVar88,0xf8);
  auVar56 = ZEXT416((uint)(auVar56._0_4_ + fVar90 * 7.5));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 8.5)),auVar88,0xf8);
  auVar57 = ZEXT416((uint)(fVar90 * 8.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 9.5)),auVar88,0xf8);
  auVar58 = ZEXT416((uint)(fVar90 * 9.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 10.5)),auVar88,0xf8);
  auVar59 = ZEXT416((uint)(fVar90 * 10.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar89,ZEXT416((uint)(fVar90 * 11.5)),auVar88,0xf8);
  fVar69 = auVar52._0_4_;
  fVar64 = fVar69 + auVar50._0_4_;
  fVar5 = fVar69 + auVar49._0_4_;
  auVar52 = ZEXT416((uint)(fVar90 * 11.5 + auVar60._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  fVar90 = fVar69 - auVar49._0_4_;
  fVar63 = fVar69 - auVar50._0_4_;
  fVar68 = fVar69 - auVar51._0_4_;
  fVar72 = fVar69 - auVar53._0_4_;
  fVar79 = fVar69 - auVar54._0_4_;
  fVar69 = fVar69 - auVar55._0_4_;
  fVar83 = auVar56._0_4_;
  fVar6 = fVar83 - auVar51._0_4_;
  fVar7 = fVar83 - auVar53._0_4_;
  fVar8 = fVar83 - auVar54._0_4_;
  fVar9 = fVar83 - auVar55._0_4_;
  fVar10 = fVar83 - auVar57._0_4_;
  fVar11 = fVar83 - auVar58._0_4_;
  fVar12 = fVar83 - auVar59._0_4_;
  fVar83 = fVar83 - auVar52._0_4_;
  gauss_s1_c0[0] = expf(fVar64 * fVar64 * fVar62);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar62);
  gauss_s1_c0[2] = expf(fVar90 * fVar90 * fVar62);
  gauss_s1_c0[3] = expf(fVar63 * fVar63 * fVar62);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar68 * fVar68 * fVar62);
  gauss_s1_c0[6] = expf(fVar72 * fVar72 * fVar62);
  gauss_s1_c0[7] = expf(fVar79 * fVar79 * fVar62);
  gauss_s1_c0[8] = expf(fVar69 * fVar69 * fVar62);
  gauss_s1_c1[0] = expf(fVar6 * fVar6 * fVar62);
  gauss_s1_c1[1] = expf(fVar7 * fVar7 * fVar62);
  gauss_s1_c1[2] = expf(fVar8 * fVar8 * fVar62);
  gauss_s1_c1[3] = expf(fVar9 * fVar9 * fVar62);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar10 * fVar10 * fVar62);
  gauss_s1_c1[6] = expf(fVar11 * fVar11 * fVar62);
  gauss_s1_c1[7] = expf(fVar12 * fVar12 * fVar62);
  gauss_s1_c1[8] = expf(fVar83 * fVar83 * fVar62);
  auVar67._8_4_ = 0x7fffffff;
  auVar67._0_8_ = 0x7fffffff7fffffff;
  auVar67._12_4_ = 0x7fffffff;
  uVar22 = 0xfffffff8;
  fVar64 = 0.0;
  lVar21 = 0;
  lVar31 = 0;
  local_e8 = 0;
  do {
    pfVar37 = gauss_s1_c1;
    uVar20 = (uint)uVar22;
    if (uVar20 != 7) {
      pfVar37 = gauss_s1_c0;
    }
    lVar30 = (long)local_e8;
    lVar31 = (long)(int)lVar31;
    if (uVar20 == 0xfffffff8) {
      pfVar37 = gauss_s1_c1;
    }
    uVar41 = 0;
    local_e8 = local_e8 + 4;
    uVar36 = 0xfffffff8;
    lVar38 = (long)haarResponseX + lVar21;
    lVar29 = (long)haarResponseY + lVar21;
    do {
      pfVar47 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar47 = gauss_s1_c0;
      }
      auVar91 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar36 == 0xfffffff8) {
        pfVar47 = gauss_s1_c1;
      }
      uVar23 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      uVar27 = uVar41;
      lVar32 = lVar29;
      lVar46 = lVar38;
      do {
        lVar39 = 0;
        pfVar24 = (float *)((long)pfVar37 + (ulong)(uint)((int)(uVar22 >> 0x1f) << 5));
        do {
          fVar5 = pfVar47[uVar23] * *pfVar24;
          pfVar24 = pfVar24 + (ulong)(~uVar20 >> 0x1f) * 2 + -1;
          auVar49 = vinsertps_avx(ZEXT416(*(uint *)(lVar32 + lVar39 * 4)),
                                  ZEXT416(*(uint *)(lVar46 + lVar39 * 4)),0x10);
          lVar39 = lVar39 + 1;
          auVar77._0_4_ = fVar5 * auVar49._0_4_;
          auVar77._4_4_ = fVar5 * auVar49._4_4_;
          auVar77._8_4_ = fVar5 * auVar49._8_4_;
          auVar77._12_4_ = fVar5 * auVar49._12_4_;
          auVar49 = vandps_avx(auVar77,auVar67);
          auVar49 = vmovlhps_avx(auVar77,auVar49);
          auVar71._0_4_ = auVar91._0_4_ + auVar49._0_4_;
          auVar71._4_4_ = auVar91._4_4_ + auVar49._4_4_;
          auVar71._8_4_ = auVar91._8_4_ + auVar49._8_4_;
          auVar71._12_4_ = auVar91._12_4_ + auVar49._12_4_;
          auVar91 = ZEXT1664(auVar71);
        } while (lVar39 != 9);
        uVar27 = uVar27 + 0x18;
        uVar23 = uVar23 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar46 = lVar46 + 0x60;
        lVar32 = lVar32 + 0x60;
      } while (uVar27 < uVar36 * 0x18 + 0x198);
      uVar36 = uVar36 + 5;
      uVar41 = uVar41 + 0x78;
      fVar5 = gauss_s2_arr[lVar30];
      auVar14._4_4_ = fVar5;
      auVar14._0_4_ = fVar5;
      auVar14._8_4_ = fVar5;
      auVar14._12_4_ = fVar5;
      auVar51 = vmulps_avx512vl(auVar71,auVar14);
      lVar30 = lVar30 + 1;
      auVar74._0_4_ = auVar51._0_4_ * auVar51._0_4_;
      auVar74._4_4_ = auVar51._4_4_ * auVar51._4_4_;
      auVar74._8_4_ = auVar51._8_4_ * auVar51._8_4_;
      auVar74._12_4_ = auVar51._12_4_ * auVar51._12_4_;
      auVar50 = vshufpd_avx(auVar51,auVar51,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar31) = auVar51;
      lVar31 = lVar31 + 4;
      lVar38 = lVar38 + 0x1e0;
      lVar29 = lVar29 + 0x1e0;
      auVar49 = vmovshdup_avx(auVar74);
      auVar52 = vfmadd231ss_fma(auVar49,auVar51,auVar51);
      auVar49 = vshufps_avx(auVar51,auVar51,0xff);
      auVar50 = vfmadd213ss_fma(auVar50,auVar50,auVar52);
      auVar49 = vfmadd213ss_fma(auVar49,auVar49,auVar50);
      fVar64 = fVar64 + auVar49._0_4_;
    } while (local_e8 != (int)lVar30);
    lVar21 = lVar21 + 0x14;
    uVar22 = (ulong)(uVar20 + 5);
  } while ((int)uVar20 < 3);
  if (fVar64 < 0.0) {
    fVar64 = sqrtf(fVar64);
  }
  else {
    auVar49 = vsqrtss_avx(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
    fVar64 = auVar49._0_4_;
  }
  lVar21 = 0;
  auVar91 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar64)));
  do {
    auVar61 = vmulps_avx512f(auVar91,*(undefined1 (*) [64])(ipoint->descriptor + lVar21));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar21) = auVar61;
    lVar21 = lVar21 + 0x10;
  } while (lVar21 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_1_8_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                float ipoint_x_sub_int_scale_add_k6_mul_scale = ipoint_x_sub_int_scale + k6 * scale;
                float ipoint_x_sub_int_scale_add_k7_mul_scale = ipoint_x_sub_int_scale + k7 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_k6_mul_scale + (ipoint_x_sub_int_scale_add_k6_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_k7_mul_scale + (ipoint_x_sub_int_scale_add_k7_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=1, l_count+=1) {
            int l0 = l + 0;
            int l_count0 = l_count + 0;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);

            for (int k=-12, k_count=0; k<12; k+=8, k_count+=8) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k6 = k + 6;
                int k7 = k + 7;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int k_count6 = k_count + 6;
                int k_count7 = k_count + 7;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);
                int sample_x_sub_int_scale6 = (int) (ipoint_x_sub_int_scale_add_05 + k6 * scale);
                int sample_x_sub_int_scale7 = (int) (ipoint_x_sub_int_scale_add_05 + k7 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale6, int_scale, &haarResponseX[l_count0*24+k_count6], &haarResponseY[l_count0*24+k_count6]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale7, int_scale, &haarResponseX[l_count0*24+k_count7], &haarResponseY[l_count0*24+k_count7]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}